

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Enum * __thiscall
kratos::Generator::enum_
          (Generator *this,string *enum_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *definition,uint32_t width)

{
  element_type *peVar1;
  undefined1 local_38 [8];
  shared_ptr<kratos::Enum> p;
  uint32_t width_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *definition_local;
  string *enum_name_local;
  Generator *this_local;
  
  p.super___shared_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = width;
  std::
  make_shared<kratos::Enum,std::__cxx11::string_const&,std::map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,unsigned_int&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)enum_name,(uint *)definition);
  Enum::verify_naming_conflict(&this->enums_,enum_name,definition);
  std::
  map<std::__cxx11::string,std::shared_ptr<kratos::Enum>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Enum>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::Enum>&>
            ((map<std::__cxx11::string,std::shared_ptr<kratos::Enum>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Enum>>>>
              *)&this->enums_,enum_name,(shared_ptr<kratos::Enum> *)local_38);
  peVar1 = std::__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Enum,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     local_38);
  std::shared_ptr<kratos::Enum>::~shared_ptr((shared_ptr<kratos::Enum> *)local_38);
  return peVar1;
}

Assistant:

Enum &Generator::enum_(const std::string &enum_name,
                       const std::map<std::string, uint64_t> &definition, uint32_t width) {
    auto p = std::make_shared<Enum>(enum_name, definition, width);
    Enum::verify_naming_conflict(enums_, enum_name, definition);
    enums_.emplace(enum_name, p);
    return *p;
}